

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divu_small_test.cc
# Opt level: O0

void __thiscall
DivuSmallTest_TestDIVUuptoMAX_Test::TestBody(DivuSmallTest_TestDIVUuptoMAX_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  AssertionResult gtest_ar;
  uint32_t x;
  int d;
  char (*in_stack_ffffffffffffff48) [6];
  AssertHelper *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Message *in_stack_ffffffffffffff60;
  Message *in_stack_ffffffffffffff68;
  Type type;
  AssertHelper *in_stack_ffffffffffffff80;
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_20;
  uint local_10;
  uint local_c;
  
  local_c = 1;
  do {
    if (0x400 < (int)local_c) {
      return;
    }
    for (local_10 = 1; local_10 < 0xf4241; local_10 = local_10 + 1) {
      ::get_msb(local_c);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((char *)in_stack_ffffffffffffff68,(char *)in_stack_ffffffffffffff60,
                 (uint *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (uint *)in_stack_ffffffffffffff50);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff80);
        testing::Message::operator<<
                  ((Message *)in_stack_ffffffffffffff50,(char (*) [3])in_stack_ffffffffffffff48);
        testing::Message::operator<<
                  ((Message *)in_stack_ffffffffffffff50,(uint *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff80 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffff50,(char (*) [4])in_stack_ffffffffffffff48
                       );
        pMVar2 = testing::Message::operator<<
                           ((Message *)in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
        type = (Type)((ulong)pMVar2 >> 0x20);
        pMVar2 = testing::Message::operator<<
                           ((Message *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff68 =
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffff50,(uint *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff60 =
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffff50,(char (*) [5])in_stack_ffffffffffffff48
                       );
        in_stack_ffffffffffffff58 =
             (undefined4)
             ((ulong)OD_DIVU_SMALL_CONSTS[(int)(local_c - 1)][0] * (ulong)local_10 +
              (ulong)OD_DIVU_SMALL_CONSTS[(int)(local_c - 1)][1] >> 0x20);
        in_stack_ffffffffffffff5c = ::get_msb(local_c);
        in_stack_ffffffffffffff50 =
             (AssertHelper *)
             testing::Message::operator<<
                       ((Message *)in_stack_ffffffffffffff50,(uint *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff48 =
             (char (*) [6])testing::AssertionResult::failure_message((AssertionResult *)0x509606);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_ffffffffffffff80,type,(char *)pMVar2,
                   (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),(char *)in_stack_ffffffffffffff60
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
        testing::Message::~Message((Message *)0x509652);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x5096b1);
      if (!bVar1) {
        return;
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

TEST(DivuSmallTest, TestDIVUuptoMAX) {
  for (int d = 1; d <= OD_DIVU_DMAX; d++) {
    for (uint32_t x = 1; x <= 1000000; x++) {
      GTEST_ASSERT_EQ(x / d, OD_DIVU_SMALL(x, d))
          << "x=" << x << " d=" << d << " x/d=" << (x / d)
          << " != " << OD_DIVU_SMALL(x, d);
    }
  }
}